

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

SquareMatrix<std::complex<float>_> qclab::dense::eye<std::complex<float>>(int64_t size)

{
  long lVar1;
  complex<float> in_RDX;
  data_type extraout_RDX;
  int64_t in_RSI;
  SquareMatrix<std::complex<float>_> SVar2;
  
  SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)size,in_RSI,in_RDX);
  if (0 < in_RSI) {
    lVar1 = 0;
    do {
      *(undefined8 *)(*(long *)size * lVar1 * 8 + *(long *)(size + 8) + lVar1 * 8) = 0x3f800000;
      lVar1 = lVar1 + 1;
    } while (in_RSI != lVar1);
  }
  SVar2.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar2.size_ = size;
  return SVar2;
}

Assistant:

SquareMatrix< T > eye( const int64_t size ) {
      SquareMatrix< T > mat( size , T(0) ) ;
      #pragma omp parallel for
      for ( int64_t i = 0; i < size; i++ ) {
        mat(i,i) = T(1) ;
      }
      return mat ;
    }